

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UCPTrie * ucptrie_openFromBinary_63
                    (UCPTrieType type,UCPTrieValueWidth valueWidth,void *data,int32_t length,
                    int32_t *pActualLength,UErrorCode *pErrorCode)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  UCPTrie *pUVar10;
  uint32_t uVar11;
  void *pvVar12;
  long lVar13;
  uint uVar14;
  UCPTrieType UVar15;
  UCPTrieValueWidth UVar16;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UCPTrie *)0x0;
  }
  if ((((length < 1) || ((uint)(valueWidth + ~UCPTRIE_VALUE_BITS_8) < 0xfffffffc)) ||
      ((uint)(type + ~UCPTRIE_TYPE_SMALL) < 0xfffffffd)) || (((ulong)data & 3) != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (((0xf < (uint)length) && (*data == 0x54726933)) &&
       (uVar1 = *(ushort *)((long)data + 4), (uVar1 & 0x38) == 0)) {
      UVar16 = (uint)uVar1 & 7;
      if (((uint)UVar16 < 3) && (UVar15 = (uint)(uVar1 >> 6) & 3, (uint)UVar15 < 2)) {
        if ((valueWidth < UCPTRIE_VALUE_BITS_16 || UVar16 == valueWidth) &&
           (type < UCPTRIE_TYPE_FAST || UVar15 == type)) {
          uVar2 = *(ushort *)((long)data + 6);
          uVar6 = CONCAT22((short)(((uint)uVar1 << 4) >> 0x10),*(undefined2 *)((long)data + 8));
          iVar8 = (uint)uVar2 * 2 + 0x10;
          if (UVar16 == UCPTRIE_VALUE_BITS_32) {
            uVar9 = iVar8 + uVar6 * 4;
          }
          else if ((uVar1 & 7) == 0) {
            uVar9 = (uVar6 + uVar2) * 2 + 0x10;
          }
          else {
            uVar9 = iVar8 + uVar6;
          }
          if (uVar9 <= (uint)length) {
            uVar3 = *(ushort *)((long)data + 0xe);
            uVar4 = *(ushort *)((long)data + 0xc);
            uVar5 = *(uint16_t *)((long)data + 10);
            pUVar10 = (UCPTrie *)uprv_malloc_63(0x30);
            if (pUVar10 == (UCPTrie *)0x0) {
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              return (UCPTrie *)0x0;
            }
            iVar8 = (uint)uVar3 * 0x200;
            uVar14 = (uVar1 & 0xf00) * 0x100 + (uint)uVar4;
            pUVar10->indexLength = (uint)uVar2;
            pUVar10->dataLength = uVar6;
            pUVar10->highStart = iVar8;
            pUVar10->shifted12HighStart = (uint16_t)(iVar8 + 0xfffU >> 0xc);
            pUVar10->type = (int8_t)UVar15;
            pUVar10->valueWidth = (int8_t)UVar16;
            pUVar10->reserved32 = 0;
            pUVar10->reserved16 = 0;
            pUVar10->index3NullOffset = uVar5;
            pUVar10->dataNullOffset = uVar14;
            pUVar10->index = (uint16_t *)((long)data + 0x10);
            uVar7 = uVar6 - 2;
            if (uVar14 < uVar6) {
              uVar7 = uVar14;
            }
            pvVar12 = (void *)((long)data + (ulong)uVar2 * 2 + 0x10);
            (pUVar10->data).ptr0 = pvVar12;
            lVar13 = (long)(int)uVar7;
            if (UVar16 == UCPTRIE_VALUE_BITS_8) {
              uVar11 = (uint32_t)*(byte *)((long)pvVar12 + lVar13);
            }
            else if (UVar16 == UCPTRIE_VALUE_BITS_32) {
              uVar11 = *(uint32_t *)((long)pvVar12 + lVar13 * 4);
            }
            else {
              uVar11 = (uint32_t)*(ushort *)((long)pvVar12 + lVar13 * 2);
            }
            pUVar10->nullValue = uVar11;
            if (pActualLength != (int32_t *)0x0) {
              *pActualLength = uVar9;
              return pUVar10;
            }
            return pUVar10;
          }
        }
      }
    }
    *pErrorCode = U_INVALID_FORMAT_ERROR;
  }
  return (UCPTrie *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }